

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.hpp
# Opt level: O3

bool __thiscall
soplex::
SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::minReEnter(SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *sel,
            number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *maxabs,SPxId *id,int nr,bool polish)

{
  uint *puVar1;
  int iVar2;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar3;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar4;
  Item *pIVar5;
  pointer pnVar6;
  undefined8 uVar7;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar8;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pVVar9;
  undefined8 uVar10;
  int iVar11;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar12;
  uint uVar13;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pVVar14;
  pointer pnVar15;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar16;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar17;
  long lVar18;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pVVar19;
  cpp_dec_float<50U,_int,_void> *pcVar20;
  fpclass_type fVar21;
  int32_t iVar22;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<50U,_int,_void> local_158;
  cpp_dec_float<50U,_int,_void> *local_120;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_118;
  cpp_dec_float<50U,_int,_void> local_d8;
  long local_98;
  int local_8c;
  cpp_dec_float<50U,_int,_void> local_88;
  cpp_dec_float<50U,_int,_void> *local_50;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_48;
  SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_40;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_38;
  
  local_158.fpclass = cpp_dec_float_finite;
  local_158.prec_elem = 10;
  local_158.data._M_elems[0] = 0;
  local_158.data._M_elems[1] = 0;
  local_158.data._M_elems[2] = 0;
  local_158.data._M_elems[3] = 0;
  local_158.data._M_elems[4] = 0;
  local_158.data._M_elems[5] = 0;
  local_158.data._M_elems._24_5_ = 0;
  local_158.data._M_elems[7]._1_3_ = 0;
  local_158.data._M_elems._32_5_ = 0;
  local_158.data._M_elems[9]._1_3_ = 0;
  local_158.exp = 0;
  local_158.neg = false;
  local_88.fpclass = cpp_dec_float_finite;
  local_88.prec_elem = 10;
  local_88.data._M_elems[0] = 0;
  local_88.data._M_elems[1] = 0;
  local_88.data._M_elems[2] = 0;
  local_88.data._M_elems[3] = 0;
  local_88.data._M_elems[4] = 0;
  local_88.data._M_elems[5] = 0;
  local_88.data._M_elems._24_5_ = 0;
  local_88.data._M_elems[7]._1_3_ = 0;
  local_88.data._M_elems._32_5_ = 0;
  local_88.data._M_elems[9]._1_3_ = 0;
  local_88.exp = 0;
  local_88.neg = false;
  pSVar12 = (this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).thesolver;
  pUVar3 = pSVar12->thePvec;
  this_00 = &pUVar3->thedelta;
  pUVar4 = pSVar12->theCoPvec;
  iVar11 = (id->super_DataKey).info * pSVar12->theRep;
  local_120 = &sel->m_backend;
  local_50 = &maxabs->m_backend;
  if (iVar11 < 0) {
    lVar18 = (long)nr;
    if (0 < pSVar12->theRep *
            ((pSVar12->
             super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thedesc.costat)->data[lVar18]) {
      SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::clearIdx(&pUVar4->thedelta,nr);
      return true;
    }
    pVVar19 = pSVar12->theCoUbound;
    pVVar14 = pSVar12->theCoLbound;
    pnVar15 = (pUVar4->
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_158.data._M_elems._32_5_ = SUB85(*(undefined8 *)((long)(pnVar15 + lVar18) + 0x20),0);
    local_158.data._M_elems[9]._1_3_ =
         (undefined3)((ulong)*(undefined8 *)((long)(pnVar15 + lVar18) + 0x20) >> 0x28);
    local_158.data._M_elems._0_8_ = *(undefined8 *)&pnVar15[lVar18].m_backend;
    local_158.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar15[lVar18].m_backend + 8);
    local_158.data._M_elems._16_8_ = *(undefined8 *)((long)(pnVar15 + lVar18) + 0x10);
    uVar10 = *(undefined8 *)((long)(pnVar15 + lVar18) + 0x18);
    local_158.data._M_elems._24_5_ = SUB85(uVar10,0);
    local_158.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar10 >> 0x28);
    local_158.exp = *(int *)((long)(pnVar15 + lVar18) + 0x28);
    local_158.neg = *(bool *)((long)(pnVar15 + lVar18) + 0x2c);
    local_158._48_8_ = *(undefined8 *)((long)(pnVar15 + lVar18) + 0x30);
    pnVar6 = (pUVar4->thedelta).
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_88.exp = pnVar6[lVar18].m_backend.exp;
    local_88.neg = pnVar6[lVar18].m_backend.neg;
    local_88.fpclass = pnVar6[lVar18].m_backend.fpclass;
    local_88.prec_elem = pnVar6[lVar18].m_backend.prec_elem;
    local_88.data._M_elems._0_8_ = *(undefined8 *)&pnVar6[lVar18].m_backend.data;
    local_88.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar6[lVar18].m_backend.data + 8);
    puVar1 = (uint *)((long)&pnVar6[lVar18].m_backend.data + 0x10);
    local_88.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    uVar7 = *(undefined8 *)(puVar1 + 2);
    uVar10 = *(undefined8 *)((long)&pnVar6[lVar18].m_backend.data + 0x20);
    local_88.data._M_elems._32_5_ = SUB85(uVar10,0);
    local_88.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar10 >> 0x28);
    local_88.data._M_elems._24_5_ = SUB85(uVar7,0);
    local_88.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
    pVVar9 = pVVar19;
    local_98 = lVar18;
    if (local_88.fpclass == cpp_dec_float_NaN) {
LAB_002b878a:
      pNVar17 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)(pnVar15 + lVar18);
      pNVar16 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)((pVVar9->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar18);
      local_118.val.m_backend.fpclass = cpp_dec_float_finite;
      local_118.val.m_backend.prec_elem = 10;
      local_118.val.m_backend.data._M_elems[0] = 0;
      local_118.val.m_backend.data._M_elems[1] = 0;
      local_118.val.m_backend.data._M_elems[2] = 0;
      local_118.val.m_backend.data._M_elems[3] = 0;
      local_118.val.m_backend.data._M_elems[4] = 0;
      local_118.val.m_backend.data._M_elems[5] = 0;
      local_118.val.m_backend.data._M_elems._24_5_ = 0;
      local_118.val.m_backend.data._M_elems[7]._1_3_ = 0;
      local_118.val.m_backend.data._M_elems._32_5_ = 0;
      local_118.val.m_backend.data._M_elems[9]._1_3_ = 0;
      local_118.val.m_backend.exp = 0;
      local_118.val.m_backend.neg = false;
      if (&local_118 != pNVar17) {
        if (&local_118 != pNVar16) {
          uVar10 = *(undefined8 *)((long)(pNVar16->val).m_backend.data._M_elems + 0x20);
          local_118.val.m_backend.data._M_elems._32_5_ = SUB85(uVar10,0);
          local_118.val.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar10 >> 0x28);
          local_118.val.m_backend.data._M_elems._0_8_ =
               *(undefined8 *)(pNVar16->val).m_backend.data._M_elems;
          local_118.val.m_backend.data._M_elems._8_8_ =
               *(undefined8 *)((long)(pNVar16->val).m_backend.data._M_elems + 8);
          local_118.val.m_backend.data._M_elems._16_8_ =
               *(undefined8 *)((long)(pNVar16->val).m_backend.data._M_elems + 0x10);
          uVar10 = *(undefined8 *)((long)(pNVar16->val).m_backend.data._M_elems + 0x18);
          local_118.val.m_backend.data._M_elems._24_5_ = SUB85(uVar10,0);
          local_118.val.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar10 >> 0x28);
          local_118.val.m_backend.exp = *(int *)((long)&(pNVar16->val).m_backend + 0x28);
          local_118.val.m_backend.neg = *(bool *)((long)&(pNVar16->val).m_backend + 0x2c);
          local_118.val.m_backend._48_8_ = *(undefined8 *)((long)&(pNVar16->val).m_backend + 0x30);
        }
        goto LAB_002b88a3;
      }
LAB_002b883a:
      local_118.val.m_backend.fpclass = cpp_dec_float_finite;
      local_118.val.m_backend.prec_elem = 10;
      local_118.val.m_backend.neg = false;
      local_118.val.m_backend.exp = 0;
      local_118.val.m_backend.data._M_elems[9]._1_3_ = 0;
      local_118.val.m_backend.data._M_elems._32_5_ = 0;
      local_118.val.m_backend.data._M_elems[7]._1_3_ = 0;
      local_118.val.m_backend.data._M_elems._24_5_ = 0;
      local_118.val.m_backend.data._M_elems[4] = 0;
      local_118.val.m_backend.data._M_elems[5] = 0;
      local_118.val.m_backend.data._M_elems[2] = 0;
      local_118.val.m_backend.data._M_elems[3] = 0;
      local_118.val.m_backend.data._M_elems[0] = 0;
      local_118.val.m_backend.data._M_elems[1] = 0;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                ((cpp_dec_float<50U,_int,_void> *)&local_118,
                 (cpp_dec_float<50U,_int,_void> *)pNVar16);
      if (local_118.val.m_backend.data._M_elems[0] != 0 ||
          local_118.val.m_backend.fpclass != cpp_dec_float_finite) {
        local_118.val.m_backend.neg = (bool)(local_118.val.m_backend.neg ^ 1);
      }
    }
    else {
      local_d8.fpclass = cpp_dec_float_finite;
      local_d8.prec_elem = 10;
      local_d8.data._M_elems[0] = 0;
      local_d8.data._M_elems[1] = 0;
      local_d8.data._M_elems[2] = 0;
      local_d8.data._M_elems[3] = 0;
      local_d8.data._M_elems[4] = 0;
      local_d8.data._M_elems[5] = 0;
      local_d8.data._M_elems._24_5_ = 0;
      local_d8.data._M_elems[7]._1_3_ = 0;
      local_d8.data._M_elems._32_5_ = 0;
      local_d8.data._M_elems[9]._1_3_ = 0;
      local_d8.exp = 0;
      local_d8.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_d8,0.0);
      iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                         (&local_88,&local_d8);
      pSVar12 = (this->
                super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thesolver;
      if (iVar11 < 1) {
        pVVar9 = pSVar12->theCoUbound;
        pnVar15 = (pUVar4->
                  super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        goto LAB_002b878a;
      }
      pNVar16 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)((pSVar12->theCoLbound->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar18);
      pNVar17 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)((pUVar4->
                    super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar18);
      local_118.val.m_backend.fpclass = cpp_dec_float_finite;
      local_118.val.m_backend.prec_elem = 10;
      local_118.val.m_backend.data._M_elems[0] = 0;
      local_118.val.m_backend.data._M_elems[1] = 0;
      local_118.val.m_backend.data._M_elems[2] = 0;
      local_118.val.m_backend.data._M_elems[3] = 0;
      local_118.val.m_backend.data._M_elems[4] = 0;
      local_118.val.m_backend.data._M_elems[5] = 0;
      local_118.val.m_backend.data._M_elems._24_5_ = 0;
      local_118.val.m_backend.data._M_elems[7]._1_3_ = 0;
      local_118.val.m_backend.data._M_elems._32_5_ = 0;
      local_118.val.m_backend.data._M_elems[9]._1_3_ = 0;
      local_118.val.m_backend.exp = 0;
      local_118.val.m_backend.neg = false;
      if (&local_118 == pNVar17) goto LAB_002b883a;
      if (&local_118 != pNVar16) {
        uVar10 = *(undefined8 *)((long)(pNVar16->val).m_backend.data._M_elems + 0x20);
        local_118.val.m_backend.data._M_elems._32_5_ = SUB85(uVar10,0);
        local_118.val.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar10 >> 0x28);
        local_118.val.m_backend.data._M_elems._0_8_ =
             *(undefined8 *)(pNVar16->val).m_backend.data._M_elems;
        local_118.val.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((long)(pNVar16->val).m_backend.data._M_elems + 8);
        local_118.val.m_backend.data._M_elems._16_8_ =
             *(undefined8 *)((long)(pNVar16->val).m_backend.data._M_elems + 0x10);
        uVar10 = *(undefined8 *)((long)(pNVar16->val).m_backend.data._M_elems + 0x18);
        local_118.val.m_backend.data._M_elems._24_5_ = SUB85(uVar10,0);
        local_118.val.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar10 >> 0x28);
        local_118.val.m_backend.exp = *(int *)((long)&(pNVar16->val).m_backend + 0x28);
        local_118.val.m_backend.neg = *(bool *)((long)&(pNVar16->val).m_backend + 0x2c);
        local_118.val.m_backend._48_8_ = *(undefined8 *)((long)&(pNVar16->val).m_backend + 0x30);
      }
LAB_002b88a3:
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                ((cpp_dec_float<50U,_int,_void> *)&local_118,
                 (cpp_dec_float<50U,_int,_void> *)pNVar17);
    }
    local_d8.fpclass = cpp_dec_float_finite;
    local_d8.prec_elem = 10;
    local_d8.data._M_elems[0] = 0;
    local_d8.data._M_elems[1] = 0;
    local_d8.data._M_elems[2] = 0;
    local_d8.data._M_elems[3] = 0;
    local_d8.data._M_elems[4] = 0;
    local_d8.data._M_elems[5] = 0;
    local_d8.data._M_elems._24_5_ = 0;
    local_d8.data._M_elems[7]._1_3_ = 0;
    local_d8.data._M_elems._32_5_ = 0;
    local_d8.data._M_elems[9]._1_3_ = 0;
    local_d8.exp = 0;
    local_d8.neg = false;
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&local_d8,(cpp_dec_float<50U,_int,_void> *)&local_118,&local_88);
    uVar10 = CONCAT35(local_d8.data._M_elems[9]._1_3_,local_d8.data._M_elems._32_5_);
    pcVar20 = local_120;
    goto LAB_002b88ea;
  }
  if (iVar11 == 0) {
    return true;
  }
  pVVar19 = pSVar12->theUbound;
  local_38 = pSVar12->theLbound;
  pIVar5 = (pSVar12->thevectors->set).theitem;
  local_98 = (long)nr;
  iVar11 = (pSVar12->thevectors->set).thekey[local_98].idx;
  local_d8.fpclass = cpp_dec_float_finite;
  local_d8.prec_elem = 10;
  local_d8.data._M_elems[0] = 0;
  local_d8.data._M_elems[1] = 0;
  local_d8.data._M_elems[2] = 0;
  local_d8.data._M_elems[3] = 0;
  local_d8.data._M_elems[4] = 0;
  local_d8.data._M_elems[5] = 0;
  local_d8.data._M_elems._24_5_ = 0;
  local_d8.data._M_elems[7]._1_3_ = 0;
  local_d8.data._M_elems._32_5_ = 0;
  local_d8.data._M_elems[9]._1_3_ = 0;
  local_d8.exp = 0;
  local_d8.neg = false;
  iVar2 = pIVar5[iVar11].data.
          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .memused;
  if (iVar2 < 1) {
    fVar21 = cpp_dec_float_finite;
    iVar22 = 10;
  }
  else {
    pNVar16 = pIVar5[iVar11].data.
              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .m_elem;
    uVar13 = iVar2 + 1;
    local_8c = nr;
    local_48 = this_00;
    local_40 = this;
    do {
      pNVar8 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)((pUVar4->
                   super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + pNVar16->idx);
      local_118.val.m_backend.fpclass = cpp_dec_float_finite;
      local_118.val.m_backend.prec_elem = 10;
      local_118.val.m_backend.data._M_elems[0] = 0;
      local_118.val.m_backend.data._M_elems[1] = 0;
      local_118.val.m_backend.data._M_elems[2] = 0;
      local_118.val.m_backend.data._M_elems[3] = 0;
      local_118.val.m_backend.data._M_elems[4] = 0;
      local_118.val.m_backend.data._M_elems[5] = 0;
      local_118.val.m_backend.data._M_elems._24_5_ = 0;
      local_118.val.m_backend.data._M_elems[7]._1_3_ = 0;
      local_118.val.m_backend.data._M_elems._32_5_ = 0;
      local_118.val.m_backend.data._M_elems[9]._1_3_ = 0;
      local_118.val.m_backend.exp = 0;
      local_118.val.m_backend.neg = false;
      pNVar17 = pNVar16;
      if ((&local_118 != pNVar8) && (pNVar17 = pNVar8, pNVar16 != &local_118)) {
        uVar10 = *(undefined8 *)((pNVar16->val).m_backend.data._M_elems + 8);
        local_118.val.m_backend.data._M_elems._32_5_ = SUB85(uVar10,0);
        local_118.val.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar10 >> 0x28);
        local_118.val.m_backend.data._M_elems._0_8_ =
             *(undefined8 *)(pNVar16->val).m_backend.data._M_elems;
        local_118.val.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((pNVar16->val).m_backend.data._M_elems + 2);
        local_118.val.m_backend.data._M_elems._16_8_ =
             *(undefined8 *)((pNVar16->val).m_backend.data._M_elems + 4);
        uVar10 = *(undefined8 *)((pNVar16->val).m_backend.data._M_elems + 6);
        local_118.val.m_backend.data._M_elems._24_5_ = SUB85(uVar10,0);
        local_118.val.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar10 >> 0x28);
        local_118.val.m_backend.exp = (pNVar16->val).m_backend.exp;
        local_118.val.m_backend.neg = (pNVar16->val).m_backend.neg;
        local_118.val.m_backend.fpclass = (pNVar16->val).m_backend.fpclass;
        local_118.val.m_backend.prec_elem = (pNVar16->val).m_backend.prec_elem;
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                ((cpp_dec_float<50U,_int,_void> *)&local_118,
                 (cpp_dec_float<50U,_int,_void> *)pNVar17);
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                (&local_d8,(cpp_dec_float<50U,_int,_void> *)&local_118);
      pNVar16 = pNVar16 + 1;
      uVar13 = uVar13 - 1;
    } while (1 < uVar13);
    fVar21 = local_d8.fpclass;
    iVar22 = local_d8.prec_elem;
    this_00 = local_48;
    this = local_40;
    nr = local_8c;
  }
  pVVar14 = local_38;
  lVar18 = local_98;
  local_118.val.m_backend.data._M_elems._32_5_ = local_d8.data._M_elems._32_5_;
  local_118.val.m_backend.data._M_elems[9]._1_3_ = local_d8.data._M_elems[9]._1_3_;
  local_118.val.m_backend.data._M_elems[4] = local_d8.data._M_elems[4];
  local_118.val.m_backend.data._M_elems[5] = local_d8.data._M_elems[5];
  local_118.val.m_backend.data._M_elems._24_5_ = local_d8.data._M_elems._24_5_;
  local_118.val.m_backend.data._M_elems[7]._1_3_ = local_d8.data._M_elems[7]._1_3_;
  local_118.val.m_backend.data._M_elems[0] = local_d8.data._M_elems[0];
  local_118.val.m_backend.data._M_elems[1] = local_d8.data._M_elems[1];
  local_118.val.m_backend.data._M_elems[2] = local_d8.data._M_elems[2];
  local_118.val.m_backend.data._M_elems[3] = local_d8.data._M_elems[3];
  pnVar15 = (pUVar3->
            super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  *(ulong *)((long)(pnVar15 + local_98) + 0x20) =
       CONCAT35(local_d8.data._M_elems[9]._1_3_,local_d8.data._M_elems._32_5_);
  *(undefined8 *)((long)(pnVar15 + local_98) + 0x10) = local_d8.data._M_elems._16_8_;
  *(ulong *)((long)(pnVar15 + local_98) + 0x18) =
       CONCAT35(local_d8.data._M_elems[7]._1_3_,local_d8.data._M_elems._24_5_);
  *(undefined8 *)&pnVar15[local_98].m_backend = local_d8.data._M_elems._0_8_;
  *(undefined8 *)((long)&pnVar15[local_98].m_backend + 8) = local_d8.data._M_elems._8_8_;
  *(int *)((long)(pnVar15 + local_98) + 0x28) = local_d8.exp;
  *(bool *)((long)(pnVar15 + local_98) + 0x2c) = local_d8.neg;
  *(ulong *)((long)(pnVar15 + local_98) + 0x30) = CONCAT44(iVar22,fVar21);
  pSVar12 = (this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).thesolver;
  if (0 < pSVar12->theRep *
          ((pSVar12->
           super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thedesc.stat)->data[local_98]) {
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::clearIdx(this_00,nr);
    return true;
  }
  pnVar15 = (pUVar3->
            super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_158.data._M_elems._32_5_ = SUB85(*(undefined8 *)((long)(pnVar15 + local_98) + 0x20),0);
  local_158.data._M_elems[9]._1_3_ =
       (undefined3)((ulong)*(undefined8 *)((long)(pnVar15 + local_98) + 0x20) >> 0x28);
  local_158.data._M_elems._0_8_ = *(undefined8 *)&pnVar15[local_98].m_backend;
  local_158.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar15[local_98].m_backend + 8);
  local_158.data._M_elems._16_8_ = *(undefined8 *)((long)(pnVar15 + local_98) + 0x10);
  uVar10 = *(undefined8 *)((long)(pnVar15 + local_98) + 0x18);
  local_158.data._M_elems._24_5_ = SUB85(uVar10,0);
  local_158.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar10 >> 0x28);
  local_158.exp = *(int *)((long)(pnVar15 + local_98) + 0x28);
  local_158.neg = *(bool *)((long)(pnVar15 + local_98) + 0x2c);
  local_158._48_8_ = *(undefined8 *)((long)(pnVar15 + local_98) + 0x30);
  pnVar6 = (pUVar3->thedelta).
           super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_88.exp = pnVar6[local_98].m_backend.exp;
  local_88.neg = pnVar6[local_98].m_backend.neg;
  local_88.fpclass = pnVar6[local_98].m_backend.fpclass;
  local_88.prec_elem = pnVar6[local_98].m_backend.prec_elem;
  local_88.data._M_elems._0_8_ = *(undefined8 *)&pnVar6[local_98].m_backend.data;
  local_88.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar6[local_98].m_backend.data + 8);
  puVar1 = (uint *)((long)&pnVar6[local_98].m_backend.data + 0x10);
  local_88.data._M_elems._16_8_ = *(undefined8 *)puVar1;
  uVar7 = *(undefined8 *)(puVar1 + 2);
  uVar10 = *(undefined8 *)((long)&pnVar6[local_98].m_backend.data + 0x20);
  local_88.data._M_elems._32_5_ = SUB85(uVar10,0);
  local_88.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar10 >> 0x28);
  local_88.data._M_elems._24_5_ = SUB85(uVar7,0);
  local_88.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
  if (local_88.fpclass == cpp_dec_float_NaN) {
LAB_002b86db:
    pcVar20 = local_120;
    pNVar16 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)((pSVar12->theUbound->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + lVar18);
    local_118.val.m_backend.fpclass = cpp_dec_float_finite;
    local_118.val.m_backend.prec_elem = 10;
    local_118.val.m_backend.data._M_elems[0] = 0;
    local_118.val.m_backend.data._M_elems[1] = 0;
    local_118.val.m_backend.data._M_elems[2] = 0;
    local_118.val.m_backend.data._M_elems[3] = 0;
    local_118.val.m_backend.data._M_elems[4] = 0;
    local_118.val.m_backend.data._M_elems[5] = 0;
    local_118.val.m_backend.data._M_elems._24_5_ = 0;
    local_118.val.m_backend.data._M_elems[7]._1_3_ = 0;
    local_118.val.m_backend.data._M_elems._32_5_ = 0;
    local_118.val.m_backend.data._M_elems[9]._1_3_ = 0;
    local_118.val.m_backend.exp = 0;
    local_118.val.m_backend.neg = false;
    if (&local_118 ==
        (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *)(pnVar15 + lVar18)) {
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                ((cpp_dec_float<50U,_int,_void> *)&local_118,
                 (cpp_dec_float<50U,_int,_void> *)pNVar16);
      pcVar20 = local_120;
      if (local_118.val.m_backend.data._M_elems[0] != 0 ||
          local_118.val.m_backend.fpclass != cpp_dec_float_finite) goto LAB_002b882b;
    }
    else {
      if (&local_118 != pNVar16) {
        uVar10 = *(undefined8 *)((long)(pNVar16->val).m_backend.data._M_elems + 0x20);
        local_118.val.m_backend.data._M_elems._32_5_ = SUB85(uVar10,0);
        local_118.val.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar10 >> 0x28);
        local_118.val.m_backend.data._M_elems._0_8_ =
             *(undefined8 *)(pNVar16->val).m_backend.data._M_elems;
        local_118.val.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((long)(pNVar16->val).m_backend.data._M_elems + 8);
        local_118.val.m_backend.data._M_elems._16_8_ =
             *(undefined8 *)((long)(pNVar16->val).m_backend.data._M_elems + 0x10);
        uVar10 = *(undefined8 *)((long)(pNVar16->val).m_backend.data._M_elems + 0x18);
        local_118.val.m_backend.data._M_elems._24_5_ = SUB85(uVar10,0);
        local_118.val.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar10 >> 0x28);
        local_118.val.m_backend.exp = *(int *)((long)&(pNVar16->val).m_backend + 0x28);
        local_118.val.m_backend.neg = *(bool *)((long)&(pNVar16->val).m_backend + 0x2c);
        local_118.val.m_backend._48_8_ = *(undefined8 *)((long)&(pNVar16->val).m_backend + 0x30);
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                ((cpp_dec_float<50U,_int,_void> *)&local_118,
                 (cpp_dec_float<50U,_int,_void> *)(pnVar15 + lVar18));
    }
  }
  else {
    local_d8.fpclass = cpp_dec_float_finite;
    local_d8.prec_elem = 10;
    local_d8.data._M_elems[0] = 0;
    local_d8.data._M_elems[1] = 0;
    local_d8.data._M_elems[2] = 0;
    local_d8.data._M_elems[3] = 0;
    local_d8.data._M_elems[4] = 0;
    local_d8.data._M_elems[5] = 0;
    local_d8.data._M_elems._24_5_ = 0;
    local_d8.data._M_elems[7]._1_3_ = 0;
    local_d8.data._M_elems._32_5_ = 0;
    local_d8.data._M_elems[9]._1_3_ = 0;
    local_d8.exp = 0;
    local_d8.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_d8,0.0);
    iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                       (&local_88,&local_d8);
    pcVar20 = local_120;
    pSVar12 = (this->
              super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).thesolver;
    pnVar15 = (pUVar3->
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (iVar11 < 1) goto LAB_002b86db;
    pNVar16 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)((pSVar12->theLbound->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + lVar18);
    local_118.val.m_backend.fpclass = cpp_dec_float_finite;
    local_118.val.m_backend.prec_elem = 10;
    local_118.val.m_backend.data._M_elems[0] = 0;
    local_118.val.m_backend.data._M_elems[1] = 0;
    local_118.val.m_backend.data._M_elems[2] = 0;
    local_118.val.m_backend.data._M_elems[3] = 0;
    local_118.val.m_backend.data._M_elems[4] = 0;
    local_118.val.m_backend.data._M_elems[5] = 0;
    local_118.val.m_backend.data._M_elems._24_5_ = 0;
    local_118.val.m_backend.data._M_elems[7]._1_3_ = 0;
    local_118.val.m_backend.data._M_elems._32_5_ = 0;
    local_118.val.m_backend.data._M_elems[9]._1_3_ = 0;
    local_118.val.m_backend.exp = 0;
    local_118.val.m_backend.neg = false;
    if (&local_118 ==
        (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *)(pnVar15 + lVar18)) {
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                ((cpp_dec_float<50U,_int,_void> *)&local_118,
                 (cpp_dec_float<50U,_int,_void> *)pNVar16);
      if (local_118.val.m_backend.data._M_elems[0] == 0 &&
          local_118.val.m_backend.fpclass == cpp_dec_float_finite) goto LAB_002b885c;
LAB_002b882b:
      local_118.val.m_backend.neg = (bool)(local_118.val.m_backend.neg ^ 1);
    }
    else {
      if (&local_118 != pNVar16) {
        uVar10 = *(undefined8 *)((long)(pNVar16->val).m_backend.data._M_elems + 0x20);
        local_118.val.m_backend.data._M_elems._32_5_ = SUB85(uVar10,0);
        local_118.val.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar10 >> 0x28);
        local_118.val.m_backend.data._M_elems._0_8_ =
             *(undefined8 *)(pNVar16->val).m_backend.data._M_elems;
        local_118.val.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((long)(pNVar16->val).m_backend.data._M_elems + 8);
        local_118.val.m_backend.data._M_elems._16_8_ =
             *(undefined8 *)((long)(pNVar16->val).m_backend.data._M_elems + 0x10);
        uVar10 = *(undefined8 *)((long)(pNVar16->val).m_backend.data._M_elems + 0x18);
        local_118.val.m_backend.data._M_elems._24_5_ = SUB85(uVar10,0);
        local_118.val.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar10 >> 0x28);
        local_118.val.m_backend.exp = *(int *)((long)&(pNVar16->val).m_backend + 0x28);
        local_118.val.m_backend.neg = *(bool *)((long)&(pNVar16->val).m_backend + 0x2c);
        local_118.val.m_backend._48_8_ = *(undefined8 *)((long)&(pNVar16->val).m_backend + 0x30);
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                ((cpp_dec_float<50U,_int,_void> *)&local_118,
                 (cpp_dec_float<50U,_int,_void> *)(pnVar15 + lVar18));
    }
  }
LAB_002b885c:
  local_d8.fpclass = cpp_dec_float_finite;
  local_d8.prec_elem = 10;
  local_d8.data._M_elems[0] = 0;
  local_d8.data._M_elems[1] = 0;
  local_d8.data._M_elems[2] = 0;
  local_d8.data._M_elems[3] = 0;
  local_d8.data._M_elems[4] = 0;
  local_d8.data._M_elems[5] = 0;
  local_d8.data._M_elems._24_5_ = 0;
  local_d8.data._M_elems[7]._1_3_ = 0;
  local_d8.data._M_elems._32_5_ = 0;
  local_d8.data._M_elems[9]._1_3_ = 0;
  local_d8.exp = 0;
  local_d8.neg = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&local_d8,(cpp_dec_float<50U,_int,_void> *)&local_118,&local_88);
  uVar10 = CONCAT35(local_d8.data._M_elems[9]._1_3_,local_d8.data._M_elems._32_5_);
LAB_002b88ea:
  lVar18 = local_98;
  *(undefined8 *)((pcVar20->data)._M_elems + 8) = uVar10;
  *(undefined8 *)((pcVar20->data)._M_elems + 4) = local_d8.data._M_elems._16_8_;
  *(ulong *)((pcVar20->data)._M_elems + 6) =
       CONCAT35(local_d8.data._M_elems[7]._1_3_,local_d8.data._M_elems._24_5_);
  *(undefined8 *)(pcVar20->data)._M_elems = local_d8.data._M_elems._0_8_;
  *(undefined8 *)((pcVar20->data)._M_elems + 2) = local_d8.data._M_elems._8_8_;
  pcVar20->exp = local_d8.exp;
  pcVar20->neg = local_d8.neg;
  pcVar20->fpclass = local_d8.fpclass;
  pcVar20->prec_elem = local_d8.prec_elem;
  pnVar15 = (pVVar19->val).
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (((pnVar15[local_98].m_backend.fpclass == cpp_dec_float_NaN) ||
      (pnVar6 = (pVVar14->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start,
      pnVar6[local_98].m_backend.fpclass == cpp_dec_float_NaN)) ||
     (iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                         (&pnVar15[local_98].m_backend,&pnVar6[local_98].m_backend), iVar11 != 0)) {
    local_d8.fpclass = cpp_dec_float_finite;
    local_d8.prec_elem = 10;
    local_d8.data._M_elems[0] = 0;
    local_d8.data._M_elems[1] = 0;
    local_d8.data._M_elems[2] = 0;
    local_d8.data._M_elems[3] = 0;
    local_d8.data._M_elems[4] = 0;
    local_d8.data._M_elems[5] = 0;
    local_d8.data._M_elems._24_5_ = 0;
    local_d8.data._M_elems[7]._1_3_ = 0;
    local_d8.data._M_elems._32_5_ = 0;
    local_d8.data._M_elems[9]._1_3_ = 0;
    local_d8.exp = 0;
    local_d8.neg = false;
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&local_d8,&(this->fastDelta).m_backend,local_50);
    if (((pcVar20->fpclass != cpp_dec_float_NaN) && (local_d8.fpclass != cpp_dec_float_NaN)) &&
       ((iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (pcVar20,&local_d8), 0 < iVar11 &&
        (boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                   ((cpp_dec_float<50u,int,void> *)pcVar20,0.0), !polish)))) {
      if (local_88.fpclass != cpp_dec_float_NaN) {
        local_d8.fpclass = cpp_dec_float_finite;
        local_d8.prec_elem = 10;
        local_d8.data._M_elems[0] = 0;
        local_d8.data._M_elems[1] = 0;
        local_d8.data._M_elems[2] = 0;
        local_d8.data._M_elems[3] = 0;
        local_d8.data._M_elems[4] = 0;
        local_d8.data._M_elems[5] = 0;
        local_d8.data._M_elems._24_5_ = 0;
        local_d8.data._M_elems[7]._1_3_ = 0;
        local_d8.data._M_elems._32_5_ = 0;
        local_d8.data._M_elems[9]._1_3_ = 0;
        local_d8.exp = 0;
        local_d8.neg = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_d8,0.0);
        iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&local_88,&local_d8);
        if (iVar11 < 0) {
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                    (&(((this->
                        super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).thesolver)->theShift).m_backend,
                     &(pVVar19->val).
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[lVar18].m_backend);
          pnVar15 = (pVVar19->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          *(undefined8 *)&pnVar15[lVar18].m_backend.data = local_158.data._M_elems._0_8_;
          *(undefined8 *)((long)&pnVar15[lVar18].m_backend.data + 8) = local_158.data._M_elems._8_8_
          ;
          puVar1 = (uint *)((long)&pnVar15[lVar18].m_backend.data + 0x10);
          *(undefined8 *)puVar1 = local_158.data._M_elems._16_8_;
          *(ulong *)(puVar1 + 2) =
               CONCAT35(local_158.data._M_elems[7]._1_3_,local_158.data._M_elems._24_5_);
          *(ulong *)((long)&pnVar15[lVar18].m_backend.data + 0x20) =
               CONCAT35(local_158.data._M_elems[9]._1_3_,local_158.data._M_elems._32_5_);
          pnVar15[lVar18].m_backend.exp = local_158.exp;
          pnVar15[lVar18].m_backend.neg = local_158.neg;
          pnVar15[lVar18].m_backend.fpclass = local_158.fpclass;
          pnVar15[lVar18].m_backend.prec_elem = local_158.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                    (&(((this->
                        super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).thesolver)->theShift).m_backend,
                     &(pVVar19->val).
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[lVar18].m_backend);
          return false;
        }
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                (&(((this->
                    super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).thesolver)->theShift).m_backend,
                 &(pVVar14->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar18].m_backend);
      pnVar15 = (pVVar14->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)&pnVar15[lVar18].m_backend.data = local_158.data._M_elems._0_8_;
      *(undefined8 *)((long)&pnVar15[lVar18].m_backend.data + 8) = local_158.data._M_elems._8_8_;
      puVar1 = (uint *)((long)&pnVar15[lVar18].m_backend.data + 0x10);
      *(undefined8 *)puVar1 = local_158.data._M_elems._16_8_;
      *(ulong *)(puVar1 + 2) =
           CONCAT35(local_158.data._M_elems[7]._1_3_,local_158.data._M_elems._24_5_);
      *(ulong *)((long)&pnVar15[lVar18].m_backend.data + 0x20) =
           CONCAT35(local_158.data._M_elems[9]._1_3_,local_158.data._M_elems._32_5_);
      pnVar15[lVar18].m_backend.exp = local_158.exp;
      pnVar15[lVar18].m_backend.neg = local_158.neg;
      pnVar15[lVar18].m_backend.fpclass = local_158.fpclass;
      pnVar15[lVar18].m_backend.prec_elem = local_158.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                (&(((this->
                    super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).thesolver)->theShift).m_backend,
                 &(pVVar14->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar18].m_backend);
    }
  }
  else {
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)pcVar20,0.0);
    if (!polish) {
      if (((local_158.fpclass == cpp_dec_float_NaN) ||
          (pnVar15 = (pVVar19->val).
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
          pnVar15[lVar18].m_backend.fpclass == cpp_dec_float_NaN)) ||
         (iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&local_158,&pnVar15[lVar18].m_backend), iVar11 < 1)) {
        pcVar20 = &(pVVar14->val).
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar18].m_backend;
        local_d8.fpclass = cpp_dec_float_finite;
        local_d8.prec_elem = 10;
        local_d8.data._M_elems[0] = 0;
        local_d8.data._M_elems[1] = 0;
        local_d8.data._M_elems[2] = 0;
        local_d8.data._M_elems[3] = 0;
        local_d8.data._M_elems[4] = 0;
        local_d8.data._M_elems[5] = 0;
        local_d8.data._M_elems._24_5_ = 0;
        local_d8.data._M_elems[7]._1_3_ = 0;
        local_d8.data._M_elems._32_5_ = 0;
        local_d8.data._M_elems[9]._1_3_ = 0;
        local_d8.exp = 0;
        local_d8.neg = false;
        if (&local_d8 != pcVar20) {
          uVar10 = *(undefined8 *)((pcVar20->data)._M_elems + 8);
          local_d8.data._M_elems._32_5_ = SUB85(uVar10,0);
          local_d8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar10 >> 0x28);
          local_d8.data._M_elems._0_8_ = *(undefined8 *)(pcVar20->data)._M_elems;
          local_d8.data._M_elems._8_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 2);
          local_d8.data._M_elems._16_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 4);
          uVar10 = *(undefined8 *)((pcVar20->data)._M_elems + 6);
          local_d8.data._M_elems._24_5_ = SUB85(uVar10,0);
          local_d8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar10 >> 0x28);
          local_d8.exp = pcVar20->exp;
          local_d8.neg = pcVar20->neg;
          local_d8.fpclass = pcVar20->fpclass;
          local_d8.prec_elem = pcVar20->prec_elem;
        }
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                  (&local_d8,&local_158);
        pSVar12 = (this->
                  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).thesolver;
      }
      else {
        pcVar20 = &(pVVar19->val).
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar18].m_backend;
        local_d8.fpclass = cpp_dec_float_finite;
        local_d8.prec_elem = 10;
        local_d8.data._M_elems[0] = 0;
        local_d8.data._M_elems[1] = 0;
        local_d8.data._M_elems[2] = 0;
        local_d8.data._M_elems[3] = 0;
        local_d8.data._M_elems[4] = 0;
        local_d8.data._M_elems[5] = 0;
        local_d8.data._M_elems._24_5_ = 0;
        local_d8.data._M_elems[7]._1_3_ = 0;
        local_d8.data._M_elems._32_5_ = 0;
        local_d8.data._M_elems[9]._1_3_ = 0;
        local_d8.exp = 0;
        local_d8.neg = false;
        if (&local_d8 == pcVar20) {
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                    (&local_d8,&local_158);
          if (local_d8.data._M_elems[0] != 0 || local_d8.fpclass != cpp_dec_float_finite) {
            local_d8.neg = (bool)(local_d8.neg ^ 1);
          }
        }
        else {
          local_d8.data._M_elems._32_5_ = local_158.data._M_elems._32_5_;
          local_d8.data._M_elems[9]._1_3_ = local_158.data._M_elems[9]._1_3_;
          local_d8.data._M_elems[4] = local_158.data._M_elems[4];
          local_d8.data._M_elems[5] = local_158.data._M_elems[5];
          local_d8.data._M_elems._24_5_ = local_158.data._M_elems._24_5_;
          local_d8.data._M_elems[7]._1_3_ = local_158.data._M_elems[7]._1_3_;
          local_d8.data._M_elems[0] = local_158.data._M_elems[0];
          local_d8.data._M_elems[1] = local_158.data._M_elems[1];
          local_d8.data._M_elems[2] = local_158.data._M_elems[2];
          local_d8.data._M_elems[3] = local_158.data._M_elems[3];
          local_d8.exp = local_158.exp;
          local_d8.neg = local_158.neg;
          local_d8.fpclass = local_158.fpclass;
          local_d8.prec_elem = local_158.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                    (&local_d8,pcVar20);
        }
        pSVar12 = (this->
                  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).thesolver;
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                (&(pSVar12->theShift).m_backend,&local_d8);
      pnVar15 = (pVVar14->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      *(ulong *)((long)&pnVar15[lVar18].m_backend.data + 0x20) =
           CONCAT35(local_158.data._M_elems[9]._1_3_,local_158.data._M_elems._32_5_);
      puVar1 = (uint *)((long)&pnVar15[lVar18].m_backend.data + 0x10);
      *(undefined8 *)puVar1 = local_158.data._M_elems._16_8_;
      *(ulong *)(puVar1 + 2) =
           CONCAT35(local_158.data._M_elems[7]._1_3_,local_158.data._M_elems._24_5_);
      *(undefined8 *)&pnVar15[lVar18].m_backend.data = local_158.data._M_elems._0_8_;
      *(undefined8 *)((long)&pnVar15[lVar18].m_backend.data + 8) = local_158.data._M_elems._8_8_;
      pnVar15[lVar18].m_backend.exp = local_158.exp;
      pnVar15[lVar18].m_backend.neg = local_158.neg;
      pnVar15[lVar18].m_backend.fpclass = local_158.fpclass;
      pnVar15[lVar18].m_backend.prec_elem = local_158.prec_elem;
      pnVar6 = (pVVar19->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(ulong *)((long)&pnVar6[lVar18].m_backend.data + 0x20) =
           CONCAT35(local_158.data._M_elems[9]._1_3_,local_158.data._M_elems._32_5_);
      puVar1 = (uint *)((long)&pnVar6[lVar18].m_backend.data + 0x10);
      *(undefined8 *)puVar1 = local_158.data._M_elems._16_8_;
      *(ulong *)(puVar1 + 2) =
           CONCAT35(local_158.data._M_elems[7]._1_3_,local_158.data._M_elems._24_5_);
      *(undefined8 *)&pnVar6[lVar18].m_backend.data = local_158.data._M_elems._0_8_;
      *(undefined8 *)((long)&pnVar6[lVar18].m_backend.data + 8) = local_158.data._M_elems._8_8_;
      pnVar6[lVar18].m_backend.exp = pnVar15[lVar18].m_backend.exp;
      pnVar6[lVar18].m_backend.neg = pnVar15[lVar18].m_backend.neg;
      iVar22 = pnVar15[lVar18].m_backend.prec_elem;
      pnVar6[lVar18].m_backend.fpclass = pnVar15[lVar18].m_backend.fpclass;
      pnVar6[lVar18].m_backend.prec_elem = iVar22;
    }
  }
  return false;
}

Assistant:

bool SPxFastRT<R>::minReEnter(
   R& sel,
   R maxabs,
   const SPxId& id,
   int nr,
   bool polish)
{
   R x, d;
   VectorBase<R>* up;
   VectorBase<R>* low;

   UpdateVector<R>& pvec = this->thesolver->pVec();
   SSVectorBase<R>& pupd = this->thesolver->pVec().delta();
   VectorBase<R>& upb = this->thesolver->upBound();
   VectorBase<R>& lpb = this->thesolver->lpBound();
   UpdateVector<R>& cvec = this->thesolver->coPvec();
   SSVectorBase<R>& cupd = this->thesolver->coPvec().delta();
   VectorBase<R>& ucb = this->thesolver->ucBound();
   VectorBase<R>& lcb = this->thesolver->lcBound();

   if(this->thesolver->isCoId(id))
   {
      if(this->thesolver->isCoBasic(nr))
      {
         cupd.clearIdx(nr);
         return true;
      }

      x = cvec[nr];
      d = cupd[nr];
      up = &ucb;
      low = &lcb;

      if(d > 0.0)
         sel = (this->thesolver->lcBound()[nr] - cvec[nr]) / d;
      else
         sel = (this->thesolver->ucBound()[nr] - cvec[nr]) / d;
   }

   else if(this->thesolver->isId(id))
   {
      pvec[nr] = this->thesolver->vector(nr) * cvec;

      if(this->thesolver->isBasic(nr))
      {
         pupd.clearIdx(nr);
         return true;
      }

      x = pvec[nr];
      d = pupd[nr];
      up = &upb;
      low = &lpb;

      if(d > 0.0)
         sel = (this->thesolver->lpBound()[nr] - pvec[nr]) / d;
      else
         sel = (this->thesolver->upBound()[nr] - pvec[nr]) / d;
   }

   else
      return true;

   if((*up)[nr] != (*low)[nr])
   {
      if(sel > fastDelta / maxabs)
      {
         sel = 0.0;

         // prevent shifts in polishing mode to avoid a final cleanup step (i.e. simplex type switch)
         if(!polish)
         {
            if(d < 0.0)
            {
               this->thesolver->theShift -= (*up)[nr];
               (*up)[nr] = x;
               this->thesolver->theShift += (*up)[nr];
            }
            else
            {
               this->thesolver->theShift += (*low)[nr];
               (*low)[nr] = x;
               this->thesolver->theShift -= (*low)[nr];
            }
         }
      }
   }
   else
   {
      sel = 0.0;

      // prevent shifts in polishing mode to avoid a final cleanup step (i.e. simplex type switch)
      if(!polish)
      {
         if(x > (*up)[nr])
            this->thesolver->theShift += x - (*up)[nr];
         else
            this->thesolver->theShift += (*low)[nr] - x;

         (*up)[nr] = (*low)[nr] = x;
      }
   }

   return false;
}